

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_relation.cpp
# Opt level: O2

void __thiscall
duckdb::OrderRelation::OrderRelation
          (OrderRelation *this,shared_ptr<duckdb::Relation,_true> *child_p,
          vector<duckdb::OrderByNode,_true> *orders)

{
  pointer pOVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Relation *pRVar4;
  allocator local_49;
  string local_48;
  
  pRVar4 = shared_ptr<duckdb::Relation,_true>::operator->(child_p);
  ::std::__cxx11::string::string((string *)&local_48,anon_var_dwarf_4b0ffdd + 9,&local_49);
  Relation::Relation(&this->super_Relation,&pRVar4->context,ORDER_RELATION,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  (this->super_Relation)._vptr_Relation = (_func_int **)&PTR__OrderRelation_027c0de0;
  pOVar1 = (orders->super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>).
           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start =
       (orders->super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>).
       super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = pOVar1;
  (this->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (orders->super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>).
       super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (orders->super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>).
  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (orders->super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>).
  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (orders->super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>).
  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Relation::TryBindRelation(&this->super_Relation,&this->columns);
  return;
}

Assistant:

OrderRelation::OrderRelation(shared_ptr<Relation> child_p, vector<OrderByNode> orders)
    : Relation(child_p->context, RelationType::ORDER_RELATION), orders(std::move(orders)), child(std::move(child_p)) {
	D_ASSERT(child.get() != this);
	// bind the expressions
	TryBindRelation(columns);
}